

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::NaVector(NaVector *this,NaVector *rVect)

{
  uint uVar1;
  NaReal *pNVar2;
  
  this->_vptr_NaVector = (_func_int **)&PTR__NaVector_00177ae0;
  this->bOwnStorage = true;
  uVar1 = (*rVect->_vptr_NaVector[6])(rVect);
  pNVar2 = (NaReal *)operator_new__((ulong)uVar1 << 3);
  this->pVect = pNVar2;
  uVar1 = (*rVect->_vptr_NaVector[6])(rVect);
  this->nDim = uVar1;
  (*this->_vptr_NaVector[2])(this,rVect);
  return;
}

Assistant:

NaVector::NaVector (const NaVector& rVect)
{
    // Create the same vector
    bOwnStorage = true;
    pVect = new NaReal[rVect.dim()];
    nDim = rVect.dim();

    // Copy the contents of that vector to this one
    operator=(rVect);
}